

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  CURLcode CVar4;
  void **in_stack_fffffffffffffe98;
  undefined4 uVar5;
  FTP *ftp_save;
  HTTP http_proxy;
  int port [2];
  int ip [4];
  int i;
  ushort uStack_9c;
  char sep1;
  char separator [4];
  uint num;
  char *ptr;
  char *str;
  char newhost [48];
  ushort local_50;
  ushort local_4e;
  _Bool connected;
  unsigned_short newport;
  unsigned_short connectport;
  int rc;
  Curl_dns_entry *addr;
  Curl_addrinfo *conninfo;
  SessionHandle *data;
  pingpong *ppStack_28;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *pcStack_18;
  int ftpcode_local;
  connectdata *conn_local;
  
  ppStack_28 = (pingpong *)&conn->proto;
  conninfo = (Curl_addrinfo *)conn->data;
  _newport = (Curl_dns_entry *)0x0;
  local_50 = 0;
  ptr = (((SessionHandle *)conninfo)->state).buffer + 4;
  ftpc._4_4_ = ftpcode;
  pcStack_18 = conn;
  if (((conn->proto).ftpc.count1 == 0) && (ftpcode == 0xe5)) {
    _separator = strchr(ptr,0x28);
    if (_separator != (char *)0x0) {
      _separator = _separator + 1;
      iVar3 = __isoc99_sscanf(_separator,"%c%c%c%u%c",&i,(long)&i + 1,(long)&i + 2,&uStack_9c,
                              (long)&i + 3);
      if (iVar3 == 5) {
        ip[3]._3_1_ = (char)i;
        for (ip[2] = 1; ip[2] < 4; ip[2] = ip[2] + 1) {
          if (*(char *)((long)&i + (long)ip[2]) != (char)i) {
            _separator = (char *)0x0;
            break;
          }
        }
        if (_separator != (char *)0x0) {
          local_50 = uStack_9c;
          if (((((pcStack_18->bits).tunnel_proxy & 1U) == 0) &&
              (pcStack_18->proxytype != CURLPROXY_SOCKS5)) &&
             ((pcStack_18->proxytype != CURLPROXY_SOCKS5_HOSTNAME &&
              ((pcStack_18->proxytype != CURLPROXY_SOCKS4 &&
               (pcStack_18->proxytype != CURLPROXY_SOCKS4A)))))) {
            curl_msnprintf((char *)&str,0x30,"%s",pcStack_18->ip_addr_str);
          }
          else {
            curl_msnprintf((char *)&str,0x30,"%s",(pcStack_18->host).name);
          }
        }
      }
      else {
        _separator = (char *)0x0;
      }
    }
    if (_separator == (char *)0x0) {
      Curl_failf((SessionHandle *)conninfo,"Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (((conn->proto).ftpc.count1 != 1) || (ftpcode != 0xe3)) {
      if ((conn->proto).ftpc.count1 != 0) {
        Curl_failf((SessionHandle *)conninfo,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      (conn->bits).ftp_use_epsv = false;
      Curl_infof((SessionHandle *)conninfo,"disabling EPSV usage\n");
      CVar4 = Curl_pp_sendf(ppStack_28,"PASV",0);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      *(int *)((long)&ppStack_28[1].sendleft + 4) = *(int *)((long)&ppStack_28[1].sendleft + 4) + 1;
      return CURLE_OK;
    }
    while( true ) {
      uVar5 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      if (*ptr == '\0') break;
      in_stack_fffffffffffffe98 = &http_proxy.send_buffer;
      iVar3 = __isoc99_sscanf(ptr,"%d,%d,%d,%d,%d,%d",port,port + 1,ip,ip + 1,
                              in_stack_fffffffffffffe98,
                              (undefined1 *)((long)&http_proxy.send_buffer + 4));
      uVar5 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      if (iVar3 == 6) break;
      ptr = ptr + 1;
    }
    if (*ptr == '\0') {
      Curl_failf((SessionHandle *)conninfo,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if ((conninfo[0x19].ai_addrlen & 1) == 0) {
      curl_msnprintf((char *)&str,0x30,"%d.%d.%d.%d",(ulong)(uint)port[0],(ulong)(uint)port[1],
                     (ulong)(uint)ip[0],CONCAT44(uVar5,ip[1]));
    }
    else {
      Curl_infof((SessionHandle *)conninfo,
                 "Skips %d.%d.%d.%d for data connection, uses %s instead\n",(ulong)(uint)port[0],
                 (ulong)(uint)port[1],(ulong)(uint)ip[0],(ulong)(uint)ip[1],pcStack_18->ip_addr_str)
      ;
      if ((((((pcStack_18->bits).tunnel_proxy & 1U) == 0) &&
           (pcStack_18->proxytype != CURLPROXY_SOCKS5)) &&
          (pcStack_18->proxytype != CURLPROXY_SOCKS5_HOSTNAME)) &&
         ((pcStack_18->proxytype != CURLPROXY_SOCKS4 && (pcStack_18->proxytype != CURLPROXY_SOCKS4A)
          ))) {
        curl_msnprintf((char *)&str,0x30,"%s",pcStack_18->ip_addr_str);
      }
      else {
        curl_msnprintf((char *)&str,0x30,"%s",(pcStack_18->host).name);
      }
    }
    local_50 = (short)((int)http_proxy.send_buffer << 8) + http_proxy.send_buffer._4_2_;
  }
  lVar1._0_4_ = conninfo[0x1d].ai_flags;
  lVar1._4_4_ = conninfo[0x1d].ai_family;
  if ((lVar1 == 0) || (**(char **)(conninfo + 0x1d) == '\0')) {
    Curl_resolv(pcStack_18,(char *)&str,(uint)local_50,(Curl_dns_entry **)&newport);
    local_4e = local_50;
    if (_newport == (Curl_dns_entry *)0x0) {
      Curl_failf((SessionHandle *)conninfo,"Can\'t resolve new host %s:%hu",&str,(ulong)local_50);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    Curl_resolv(pcStack_18,(pcStack_18->proxy).name,(int)pcStack_18->port,
                (Curl_dns_entry **)&newport);
    local_4e = (ushort)pcStack_18->port;
    if (_newport == (Curl_dns_entry *)0x0) {
      Curl_failf((SessionHandle *)conninfo,"Can\'t resolve proxy host %s:%hu",
                 (pcStack_18->proxy).name,pcStack_18->port & 0xffff);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  data._4_4_ = Curl_connecthost(pcStack_18,_newport,pcStack_18->sock + 1,(Curl_addrinfo **)&addr,
                                (_Bool *)(newhost + 0x2f));
  Curl_resolv_unlock((SessionHandle *)conninfo,_newport);
  if (data._4_4_ == CURLE_OK) {
    (pcStack_18->bits).tcpconnect[1] = (_Bool)(newhost[0x2f] & 1);
    if (((ulong)conninfo[0x18].ai_next & 1) != 0) {
      ftp_pasv_verbose(pcStack_18,(Curl_addrinfo *)addr,(char *)&str,(uint)local_4e);
    }
    switch(pcStack_18->proxytype) {
    case CURLPROXY_HTTP:
    case CURLPROXY_HTTP_1_0:
      break;
    default:
      Curl_failf((SessionHandle *)conninfo,"unknown proxytype option given");
      data._4_4_ = CURLE_COULDNT_CONNECT;
      break;
    case CURLPROXY_SOCKS4:
      data._4_4_ = Curl_SOCKS4(pcStack_18->proxyuser,(char *)&str,(uint)local_50,1,pcStack_18,false)
      ;
      break;
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      data._4_4_ = Curl_SOCKS5(pcStack_18->proxyuser,pcStack_18->proxypasswd,(char *)&str,
                               (uint)local_50,1,pcStack_18);
      break;
    case CURLPROXY_SOCKS4A:
      data._4_4_ = Curl_SOCKS4(pcStack_18->proxyuser,(char *)&str,(uint)local_50,1,pcStack_18,true);
    }
    if (data._4_4_ == CURLE_OK) {
      if ((((pcStack_18->bits).tunnel_proxy & 1U) != 0) &&
         (((pcStack_18->bits).httpproxy & 1U) != 0)) {
        pcVar2 = conninfo[0x2e1].ai_canonname;
        memset(&ftp_save,0,0x88);
        conninfo[0x2e1].ai_canonname = (char *)&ftp_save;
        data._4_4_ = Curl_proxyCONNECT(pcStack_18,1,(char *)&str,local_50);
        conninfo[0x2e1].ai_canonname = pcVar2;
        if (data._4_4_ != CURLE_OK) {
          return data._4_4_;
        }
      }
      (pcStack_18->bits).tcpconnect[1] = true;
      state(pcStack_18,FTP_STOP);
      conn_local._4_4_ = data._4_4_;
    }
    else if ((((ftp_conn *)ppStack_28)->count1 == 0) && (ftpc._4_4_ == 0xe5)) {
      conn_local._4_4_ = ftp_epsv_disable(pcStack_18);
    }
    else {
      conn_local._4_4_ = data._4_4_;
    }
  }
  else if ((((ftp_conn *)ppStack_28)->count1 == 0) && (ftpc._4_4_ == 0xe5)) {
    conn_local._4_4_ = ftp_epsv_disable(pcStack_18);
  }
  else {
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct SessionHandle *data=conn->data;
  Curl_addrinfo *conninfo;
  struct Curl_dns_entry *addr=NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  unsigned short newport=0; /* remote port */
  bool connected;

  /* newhost must be able to hold a full IP-style address in ASCII, which
     in the IPv6 case means 5*8-1 = 39 letters */
#define NEWHOST_BUFSIZE 48
  char newhost[NEWHOST_BUFSIZE];
  char *str=&data->state.buffer[4];  /* start on the first letter */

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5  == sscanf(ptr, "%c%c%c%u%c",
                      &separator[0],
                      &separator[1],
                      &separator[2],
                      &num,
                      &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i=1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr=NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(ptr) {
          newport = (unsigned short)(num & 0xffff);

          if(conn->bits.tunnel_proxy ||
             conn->proxytype == CURLPROXY_SOCKS5 ||
             conn->proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
             conn->proxytype == CURLPROXY_SOCKS4 ||
             conn->proxytype == CURLPROXY_SOCKS4A)
            /* proxy tunnel -> use other host info because ip_addr_str is the
               proxy address not the ftp host */
            snprintf(newhost, sizeof(newhost), "%s", conn->host.name);
          else
            /* use the same IP we are already connected to */
            snprintf(newhost, NEWHOST_BUFSIZE, "%s", conn->ip_addr_str);
        }
      }
      else
        ptr=NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    int ip[4];
    int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%d,%d,%d,%d,%d,%d",
                      &ip[0], &ip[1], &ip[2], &ip[3],
                      &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the one we used
         for the control connection */
      infof(data, "Skips %d.%d.%d.%d for data connection, uses %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->ip_addr_str);
      if(conn->bits.tunnel_proxy ||
         conn->proxytype == CURLPROXY_SOCKS5 ||
         conn->proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
         conn->proxytype == CURLPROXY_SOCKS4 ||
         conn->proxytype == CURLPROXY_SOCKS4A)
        /* proxy tunnel -> use other host info because ip_addr_str is the
           proxy address not the ftp host */
        snprintf(newhost, sizeof(newhost), "%s", conn->host.name);
      else
        snprintf(newhost, sizeof(newhost), "%s", conn->ip_addr_str);
    }
    else
      snprintf(newhost, sizeof(newhost),
               "%d.%d.%d.%d", ip[0], ip[1], ip[2], ip[3]);
    newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */

    /* disable it for next transfer */
    conn->bits.ftp_use_epsv = FALSE;
    infof(data, "disabling EPSV usage\n");

    PPSENDF(&ftpc->pp, "PASV", NULL);
    ftpc->count1++;
    /* remain in the FTP_PASV state */
    return result;
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(data->set.str[STRING_PROXY] && *data->set.str[STRING_PROXY]) {
    /*
     * This is a tunnel through a http proxy and we need to connect to the
     * proxy again here.
     *
     * We don't want to rely on a former host lookup that might've expired
     * now, instead we remake the lookup here and now!
     */
    rc = Curl_resolv(conn, conn->proxy.name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu",
            conn->proxy.name, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, newhost, newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  result = Curl_connecthost(conn,
                            addr,
                            &conn->sock[SECONDARYSOCKET],
                            &conninfo,
                            &connected);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  if(result) {
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = connected;

  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect and we should not be "hanging" here waiting.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, conninfo, newhost, connectport);

  switch(conn->proxytype) {
    /* FIX: this MUST wait for a proper connect first if 'connected' is
     * FALSE */
  case CURLPROXY_SOCKS5:
  case CURLPROXY_SOCKS5_HOSTNAME:
    result = Curl_SOCKS5(conn->proxyuser, conn->proxypasswd, newhost, newport,
                         SECONDARYSOCKET, conn);
    break;
  case CURLPROXY_SOCKS4:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, FALSE);
    break;
  case CURLPROXY_SOCKS4A:
    result = Curl_SOCKS4(conn->proxyuser, newhost, newport,
                         SECONDARYSOCKET, conn, TRUE);
    break;
  case CURLPROXY_HTTP:
  case CURLPROXY_HTTP_1_0:
    /* do nothing here. handled later. */
    break;
  default:
    failf(data, "unknown proxytype option given");
    result = CURLE_COULDNT_CONNECT;
    break;
  }

  if(result) {
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);
    return result;
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
    /* FIX: this MUST wait for a proper connect first if 'connected' is
     * FALSE */

    /* BLOCKING */
    /* We want "seamless" FTP operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the member
     * conn->proto.http; we want FTP through HTTP and we have to change the
     * member temporarily for connecting to the HTTP proxy. After
     * Curl_proxyCONNECT we have to set back the member to the original struct
     * FTP pointer
     */
    struct HTTP http_proxy;
    struct FTP *ftp_save = data->state.proto.ftp;
    memset(&http_proxy, 0, sizeof(http_proxy));
    data->state.proto.http = &http_proxy;

    result = Curl_proxyCONNECT(conn, SECONDARYSOCKET, newhost, newport);

    data->state.proto.ftp = ftp_save;

    if(result)
      return result;
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}